

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDebugMarkerTests.cpp
# Opt level: O3

void deqp::gles2::Functional::anon_unknown_0::checkSupport(ContextInfo *ctxInfo)

{
  bool bVar1;
  NotSupportedError *this;
  
  bVar1 = glu::ContextInfo::isExtensionSupported(ctxInfo,"GL_EXT_debug_marker");
  if (bVar1) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"GL_EXT_debug_marker is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDebugMarkerTests.cpp"
             ,0x35);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkSupport (const glu::ContextInfo& ctxInfo)
{
	if (!ctxInfo.isExtensionSupported("GL_EXT_debug_marker"))
	{
#if (DE_OS == DE_OS_ANDROID)
		TCU_THROW(TestError, "Support for GL_EXT_debug_marker is mandatory on Android");
#else
		TCU_THROW(NotSupportedError, "GL_EXT_debug_marker is not supported");
#endif
	}
	// else no exception thrown
}